

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

PtexFaceData * __thiscall
Ptex::v2_2::PtexReader::TiledReducedFace::getTile(TiledReducedFace *this,int tile)

{
  size_t *psVar1;
  byte bVar2;
  Res RVar3;
  undefined4 uVar4;
  DataType DVar5;
  TiledFaceBase *pTVar6;
  _func_int *p_Var7;
  code *pcVar8;
  ReduceFn *pRVar9;
  long lVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  undefined4 extraout_var;
  void *pvVar15;
  void *pvVar16;
  PackedFace *pPVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FaceData *pFVar18;
  byte bVar19;
  TiledReducedFace *pTVar20;
  int iVar21;
  int iVar22;
  int vres;
  int i;
  pointer ppFVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  bool bVar28;
  undefined8 uStack_a0;
  DataType aDStack_98 [2];
  ulong uStack_90;
  PackedFace *local_88;
  ulong local_80;
  long local_78;
  pointer local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 *local_50;
  TiledReducedFace *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long *plVar14;
  
  local_70 = (this->super_TiledFaceBase)._tiles.
             super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pFVar18 = local_70[tile];
  if (pFVar18 == (FaceData *)0x0) {
    local_78 = (long)tile;
    iVar24 = this->_parentface->_ntilesu;
    iVar13 = (this->super_TiledFaceBase)._ntilesu;
    iVar22 = iVar24 / iVar13;
    local_48 = this;
    local_3c = this->_parentface->_ntilesv / (this->super_TiledFaceBase)._ntilesv;
    uVar12 = local_3c * iVar22;
    lVar10 = -((long)(int)uVar12 * 8 + 0xfU & 0xfffffffffffffff0);
    local_50 = (undefined8 *)((long)&local_88 + lVar10);
    uVar26 = (tile % iVar13) * iVar22 + (tile / iVar13) * iVar24 * local_3c;
    local_34 = iVar22;
    uVar25 = 0;
    local_80 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      local_80 = uVar25;
    }
    bVar28 = true;
    while (pTVar20 = local_48, local_80 != uVar25) {
      pTVar6 = local_48->_parentface;
      p_Var7 = (pTVar6->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9];
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415dfe;
      iVar13 = (*p_Var7)(pTVar6,(ulong)uVar26);
      plVar14 = (long *)CONCAT44(extraout_var,iVar13);
      local_50[uVar25] = plVar14;
      if (bVar28) {
        pcVar8 = *(code **)(*plVar14 + 0x18);
        *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415e18;
        cVar11 = (*pcVar8)(plVar14);
        if (cVar11 == '\0') goto LAB_00415e55;
        if (uVar25 == 0) {
          bVar28 = true;
        }
        else {
          pcVar8 = *(code **)(*(long *)*local_50 + 0x30);
          *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415e2e;
          pvVar15 = (void *)(*pcVar8)();
          pcVar8 = *(code **)(*plVar14 + 0x30);
          *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415e3a;
          pvVar16 = (void *)(*pcVar8)(plVar14);
          iVar13 = (local_48->super_TiledFaceBase)._pixelsize;
          *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415e4d;
          iVar13 = bcmp(pvVar15,pvVar16,(long)iVar13);
          bVar28 = iVar13 == 0;
        }
      }
      else {
LAB_00415e55:
        bVar28 = false;
      }
      uVar25 = uVar25 + 1;
      iVar13 = (iVar24 - iVar22) + 1;
      if ((int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) %
               (long)local_34) != 0) {
        *(undefined8 *)((long)&uStack_90 + lVar10) = 1;
        iVar13 = (int)*(undefined8 *)((long)&uStack_90 + lVar10);
      }
      uVar26 = uVar26 + iVar13;
    }
    if (bVar28) {
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x18;
      uVar25 = *(ulong *)((long)&uStack_90 + lVar10);
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415e86;
      pPVar17 = (PackedFace *)operator_new(uVar25);
      pTVar20 = local_48;
      iVar24 = (local_48->super_TiledFaceBase)._pixelsize;
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415e98;
      ConstantFace::ConstantFace((ConstantFace *)pPVar17,iVar24);
      ppFVar23 = local_70;
      lVar27 = local_78;
      local_38 = (pTVar20->super_TiledFaceBase)._pixelsize;
      p_Var7 = (((PackedFace *)&pPVar17->super_FaceData)->super_FaceData).super_PtexFaceData.
               _vptr_PtexFaceData[6];
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415eb0;
      iVar13 = (*p_Var7)(pPVar17);
      pcVar8 = *(code **)(*(long *)*local_50 + 0x30);
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415ec0;
      pvVar15 = (void *)(*pcVar8)();
      iVar24 = (pTVar20->super_TiledFaceBase)._pixelsize;
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415ecf;
      memcpy((void *)CONCAT44(extraout_var_00,iVar13),pvVar15,(long)iVar24);
    }
    else {
      iVar24 = (local_48->super_TiledFaceBase)._pixelsize;
      bVar19 = (local_48->super_TiledFaceBase)._tileres.ulog2;
      bVar2 = (local_48->super_TiledFaceBase)._tileres.vlog2;
      *(undefined8 *)((long)&uStack_90 + lVar10) = 1;
      iVar22 = (int)*(undefined8 *)((long)&uStack_90 + lVar10);
      iVar13 = ((iVar22 << (bVar19 & 0x1f)) << (bVar2 & 0x1f)) * iVar24;
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x18;
      uVar25 = *(ulong *)((long)&uStack_90 + lVar10);
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415efd;
      pPVar17 = (PackedFace *)operator_new(uVar25);
      uVar4 = *(undefined4 *)&(pTVar20->super_TiledFaceBase)._tileres;
      local_38 = iVar13;
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415f15;
      PackedFace::PackedFace(pPVar17,SUB42(uVar4,0),iVar24,iVar13);
      iVar24 = local_34;
      RVar3 = pTVar20->_parentface->_tileres;
      bVar19 = RVar3.ulog2;
      local_5c = iVar22 << (bVar19 & 0x1f);
      local_58 = iVar22 << (RVar3.vlog2 & 0x1fU);
      local_40 = (pTVar20->super_TiledFaceBase)._pixelsize;
      local_54 = local_40 << (bVar19 & 0x1f);
      local_40 = local_40 << ((pTVar20->super_TiledFaceBase)._tileres.ulog2 & 0x1fU);
      local_64 = local_40 / local_34;
      local_60 = (local_40 << ((pTVar20->super_TiledFaceBase)._tileres.vlog2 & 0x1fU)) / local_3c -
                 (local_34 + -1) * local_64;
      p_Var7 = (pPVar17->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[6];
      local_88 = pPVar17;
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415f7d;
      iVar13 = (*p_Var7)(pPVar17);
      pvVar15 = (void *)CONCAT44(extraout_var_01,iVar13);
      uVar25 = 0;
      while (ppFVar23 = local_70, pPVar17 = local_88, lVar27 = local_78, local_80 != uVar25) {
        plVar14 = (long *)local_50[uVar25];
        pcVar8 = *(code **)(*plVar14 + 0x18);
        *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415f9e;
        cVar11 = (*pcVar8)(plVar14);
        if (cVar11 == '\0') {
          pRVar9 = pTVar20->_reducefn;
          pcVar8 = *(code **)(*plVar14 + 0x30);
          *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415fec;
          pvVar16 = (void *)(*pcVar8)(plVar14);
          iVar21 = local_40;
          iVar22 = local_54;
          iVar13 = local_58;
          iVar24 = local_5c;
          DVar5 = (pTVar20->super_TiledFaceBase)._dt;
          *(ulong *)((long)&uStack_90 + lVar10) = (ulong)(uint)(pTVar20->super_TiledFaceBase)._nchan
          ;
          *(ulong *)((long)aDStack_98 + lVar10) = (ulong)DVar5;
          *(undefined8 *)((long)&uStack_a0 + lVar10) = 0x41600e;
          (*pRVar9)(pvVar16,iVar22,iVar24,iVar13,pvVar15,iVar21,
                    *(DataType *)((long)aDStack_98 + lVar10),*(int *)((long)&uStack_90 + lVar10));
          iVar24 = local_34;
        }
        else {
          pcVar8 = *(code **)(*plVar14 + 0x30);
          *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415fab;
          pvVar16 = (void *)(*pcVar8)(plVar14);
          bVar19 = (pTVar20->super_TiledFaceBase)._tileres.ulog2;
          *(undefined8 *)((long)&uStack_90 + lVar10) = 1;
          iVar22 = local_40;
          iVar21 = (int)*(undefined8 *)((long)&uStack_90 + lVar10);
          vres = (iVar21 << ((pTVar20->super_TiledFaceBase)._tileres.vlog2 & 0x1fU)) / local_3c;
          iVar13 = (pTVar20->super_TiledFaceBase)._pixelsize;
          *(undefined8 *)((long)&uStack_90 + lVar10) = 0x415fdd;
          PtexUtils::fill(pvVar16,pvVar15,iVar22,(iVar21 << (bVar19 & 0x1f)) / iVar24,vres,iVar13);
        }
        uVar25 = uVar25 + 1;
        iVar13 = local_64;
        if ((int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) %
                 (long)iVar24) == 0) {
          iVar13 = local_60;
        }
        pvVar15 = (void *)((long)pvVar15 + (long)iVar13);
      }
    }
    LOCK();
    bVar28 = ppFVar23[lVar27] == (FaceData *)0x0;
    if (bVar28) {
      ppFVar23[lVar27] = &pPVar17->super_FaceData;
    }
    UNLOCK();
    if (bVar28) {
      if ((long)local_38 + 0x18 != 0) {
        LOCK();
        psVar1 = &((pTVar20->super_TiledFaceBase)._reader)->_memUsed;
        *psVar1 = *psVar1 + (long)local_38 + 0x18;
        UNLOCK();
      }
    }
    else {
      p_Var7 = (((PackedFace *)&pPVar17->super_FaceData)->super_FaceData).super_PtexFaceData.
               _vptr_PtexFaceData[1];
      *(undefined8 *)((long)&uStack_90 + lVar10) = 0x41606b;
      (*p_Var7)(pPVar17);
    }
    pFVar18 = ppFVar23[lVar27];
  }
  return &pFVar18->super_PtexFaceData;
}

Assistant:

PtexFaceData* PtexReader::TiledReducedFace::getTile(int tile)
{
    FaceData*& face = _tiles[tile];
    if (face) {
        return face;
    }

    // first, get all parent tiles for this tile
    // and check if they are constant (with the same value)
    int pntilesu = _parentface->ntilesu();
    int pntilesv = _parentface->ntilesv();
    int nu = pntilesu / _ntilesu; // num parent tiles for this tile in u dir
    int nv = pntilesv / _ntilesv; // num parent tiles for this tile in v dir

    int ntilesval = nu*nv; // num parent tiles for this tile
    PtexFaceData** tiles = (PtexFaceData**) alloca(ntilesval * sizeof(PtexFaceData*));
    bool allConstant = true;
    int ptile = (tile/_ntilesu) * nv * pntilesu + (tile%_ntilesu) * nu;
    for (int i = 0; i < ntilesval;) {
        PtexFaceData* tileval = tiles[i] = _parentface->getTile(ptile);
        allConstant = (allConstant && tileval->isConstant() &&
                       (i==0 || (0 == memcmp(tiles[0]->getData(), tileval->getData(),
                                             _pixelsize))));
        i++;
        ptile += (i%nu)? 1 : pntilesu - nu + 1;
    }

    FaceData* newface = 0;
    size_t newMemUsed = 0;
    if (allConstant) {
        // allocate a new constant face
        newface = new ConstantFace(_pixelsize);
        newMemUsed = sizeof(ConstantFace) + _pixelsize;
        memcpy(newface->getData(), tiles[0]->getData(), _pixelsize);
    }
    else {
        // allocate a new packed face for the tile
        int memsize = _pixelsize*_tileres.size();
        newface = new PackedFace(_tileres, _pixelsize, memsize);
        newMemUsed = sizeof(PackedFace) + memsize;

        // generate reduction from parent tiles
        int ptileures = _parentface->tileres().u();
        int ptilevres = _parentface->tileres().v();
        int sstride = ptileures * _pixelsize;
        int dstride = _tileres.u() * _pixelsize;
        int dstepu = dstride/nu;
        int dstepv = dstride*_tileres.v()/nv - dstepu*(nu-1);

        char* dst = (char*) newface->getData();
        for (int i = 0; i < ntilesval;) {
            PtexFaceData* tileval = tiles[i];
            if (tileval->isConstant())
                PtexUtils::fill(tileval->getData(), dst, dstride,
                                _tileres.u()/nu, _tileres.v()/nv,
                                _pixelsize);
            else
                _reducefn(tileval->getData(), sstride, ptileures, ptilevres,
                          dst, dstride, _dt, _nchan);
            i++;
            dst += (i%nu) ? dstepu : dstepv;
        }
    }

    if (!AtomicCompareAndSwap(&face, (FaceData*)0, newface)) {
        delete newface;
    }
    else {
        _reader->increaseMemUsed(newMemUsed);
    }

    return face;
}